

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O3

void fekete_rule(int rule,int param_2,double *xy,double *w)

{
  double dVar1;
  int iVar2;
  uint suborder_num;
  int iVar3;
  int iVar4;
  int iVar5;
  double *suborder_xyz;
  double *suborder_w;
  int *piVar6;
  ostream *poVar7;
  int iVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  
  suborder_num = fekete_suborder_num(rule);
  suborder_xyz = (double *)operator_new__((ulong)(suborder_num * 0x18));
  suborder_w = (double *)operator_new__((ulong)(suborder_num * 8));
  piVar6 = fekete_suborder(rule,suborder_num);
  fekete_subrule(rule,suborder_num,suborder_xyz,suborder_w);
  uVar9 = 0;
  iVar5 = 0;
  do {
    iVar3 = piVar6[uVar9];
    if (iVar3 == 1) {
      xy[iVar5 * 2] = suborder_xyz[uVar9 * 3];
      xy[iVar5 * 2 + 1] = suborder_xyz[uVar9 * 3 + 1];
      w[iVar5] = suborder_w[uVar9];
      iVar5 = iVar5 + 1;
    }
    else {
      iVar2 = (int)uVar9;
      if (iVar3 == 3) {
        pdVar10 = xy + (long)iVar5 * 2 + 1;
        lVar11 = 0;
        do {
          iVar3 = i4_wrap((int)lVar11,0,2);
          pdVar10[-1] = suborder_xyz[iVar3 + iVar2 * 3];
          iVar4 = (int)(lVar11 + 1);
          iVar3 = i4_wrap(iVar4,0,2);
          *pdVar10 = suborder_xyz[iVar3 + iVar2 * 3];
          w[iVar5 + lVar11] = suborder_w[uVar9];
          pdVar10 = pdVar10 + 2;
          lVar11 = lVar11 + 1;
        } while (iVar4 != 3);
        iVar5 = iVar5 + 3;
      }
      else {
        if (iVar3 != 6) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"FEKETE_RULE - Fatal error!\n;");
          poVar7 = std::operator<<((ostream *)&std::cerr,"  Illegal SUBORDER(");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar2);
          poVar7 = std::operator<<(poVar7,") = ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,piVar6[uVar9]);
          std::operator<<(poVar7,"\n");
          exit(1);
        }
        iVar2 = iVar2 * 3;
        pdVar10 = xy + (long)iVar5 * 2 + 1;
        lVar11 = 0;
        iVar3 = iVar5;
        do {
          iVar3 = iVar3 + 1;
          iVar4 = i4_wrap((int)lVar11,0,2);
          pdVar10[-1] = suborder_xyz[iVar4 + iVar2];
          iVar8 = (int)(lVar11 + 1);
          iVar4 = i4_wrap(iVar8,0,2);
          *pdVar10 = suborder_xyz[iVar4 + iVar2];
          dVar1 = suborder_w[uVar9];
          w[iVar5 + lVar11] = dVar1;
          pdVar10 = pdVar10 + 2;
          lVar11 = lVar11 + 1;
        } while (iVar8 != 3);
        lVar11 = (long)iVar3 << 3;
        iVar5 = iVar5 + 6;
        iVar3 = 0;
        do {
          iVar8 = iVar3 + 1;
          iVar4 = i4_wrap(iVar8,0,2);
          *(double *)((long)xy + lVar11 * 2) = suborder_xyz[iVar4 + iVar2];
          iVar3 = i4_wrap(iVar3,0,2);
          *(double *)((long)xy + lVar11 * 2 + 8) = suborder_xyz[iVar3 + iVar2];
          *(double *)((long)w + lVar11) = dVar1;
          lVar11 = lVar11 + 8;
          iVar3 = iVar8;
        } while (iVar8 != 3);
      }
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != suborder_num);
  operator_delete__(piVar6);
  operator_delete__(suborder_xyz);
  operator_delete__(suborder_w);
  return;
}

Assistant:

void fekete_rule ( int rule, int /*order_num*/, double xy[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_RULE returns the points and weights of a Fekete rule.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 January 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Input, int ORDER_NUM, the order (number of points) of the rule.
//
//    Output, double XY[2*ORDER_NUM], the points of the rule.
//
//    Output, double W[ORDER_NUM], the weights of the rule.
//
{
  int k;
  int o;
  int s;
  int *suborder;
  int suborder_num;
  double *suborder_w;
  double *suborder_xyz;
//
//  Get the suborder information.
//
  suborder_num = fekete_suborder_num ( rule );

  suborder_xyz = new double[3*suborder_num];
  suborder_w = new double[suborder_num];

  suborder = fekete_suborder ( rule, suborder_num );

  fekete_subrule ( rule, suborder_num, suborder_xyz, suborder_w );
//
//  Expand the suborder information to a full order rule.
//
  o = 0;

  for ( s = 0; s < suborder_num; s++ )
  {
    if ( suborder[s] == 1 )
    {
      xy[0+o*2] = suborder_xyz[0+s*3];
      xy[1+o*2] = suborder_xyz[1+s*3];
      w[o] = suborder_w[s];
      o = o + 1;
    }
    else if ( suborder[s] == 3 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else if ( suborder[s] == 6 )
    {
      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }

      for ( k = 0; k < 3; k++ )
      {
        xy[0+o*2] = suborder_xyz [ i4_wrap(k+1,0,2) + s*3 ];
        xy[1+o*2] = suborder_xyz [ i4_wrap(k,  0,2) + s*3 ];
        w[o] = suborder_w[s];
        o = o + 1;
      }
    }
    else
    {
      std::cerr << "\n";
      std::cerr << "FEKETE_RULE - Fatal error!\n;";
      std::cerr << "  Illegal SUBORDER(" << s << ") = " << suborder[s] << "\n";
      exit ( 1 );
    }
  }

  delete [] suborder;
  delete [] suborder_xyz;
  delete [] suborder_w;

  return;
}